

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

Info * __thiscall Ptex::v2_2::PtexReader::getInfo(Info *__return_storage_ptr__,PtexReader *this)

{
  undefined4 uVar1;
  uint6 uVar2;
  uint32_t uVar3;
  
  uVar3 = (this->_header).datatype;
  __return_storage_ptr__->meshType = (this->_header).meshtype;
  __return_storage_ptr__->dataType = uVar3;
  __return_storage_ptr__->uBorderMode = (uint)(this->_extheader).ubordermode;
  uVar1._0_2_ = (this->_extheader).vbordermode;
  uVar1._2_2_ = (this->_extheader).edgefiltermode;
  uVar2 = CONCAT24(uVar1._2_2_,uVar1);
  __return_storage_ptr__->vBorderMode = (int)(ulong)(uVar2 & 0xffff0000ffff);
  __return_storage_ptr__->edgeFilterMode = (int)((ulong)(uVar2 & 0xffff0000ffff) >> 0x20);
  __return_storage_ptr__->alphaChannel = (this->_header).alphachan;
  __return_storage_ptr__->numChannels = (uint)(this->_header).nchannels;
  __return_storage_ptr__->numFaces = (this->_header).nfaces;
  return __return_storage_ptr__;
}

Assistant:

virtual Info getInfo() {
        Info info;
        info.meshType = MeshType(_header.meshtype);
        info.dataType = DataType(_header.datatype);
        info.uBorderMode = BorderMode(_extheader.ubordermode);
        info.vBorderMode = BorderMode(_extheader.vbordermode);
        info.edgeFilterMode = EdgeFilterMode(_extheader.edgefiltermode);
        info.alphaChannel = _header.alphachan;
        info.numChannels = _header.nchannels;
        info.numFaces = _header.nfaces;
        return info;
    }